

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O0

TextMeasures * __thiscall
PDFUsedFont::CalculateTextDimensions
          (TextMeasures *__return_storage_ptr__,PDFUsedFont *this,string *inText,long inFontSize)

{
  ULongList *inUnicodeCharacters;
  undefined1 local_50 [8];
  UnicodeString unicode;
  UIntList glyphs;
  long inFontSize_local;
  string *inText_local;
  PDFUsedFont *this_local;
  
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
             &unicode.mUnicodeCharacters.
              super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
              _M_size);
  UnicodeString::UnicodeString((UnicodeString *)local_50);
  UnicodeString::FromUTF8((UnicodeString *)local_50,inText);
  inUnicodeCharacters = UnicodeString::GetUnicodeList_abi_cxx11_((UnicodeString *)local_50);
  FreeTypeFaceWrapper::GetGlyphsForUnicodeText
            (&this->mFaceWrapper,inUnicodeCharacters,
             (UIntList *)
             &unicode.mUnicodeCharacters.
              super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
              _M_size);
  CalculateTextDimensions
            (__return_storage_ptr__,this,
             (UIntList *)
             &unicode.mUnicodeCharacters.
              super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
              _M_size,inFontSize);
  UnicodeString::~UnicodeString((UnicodeString *)local_50);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
             &unicode.mUnicodeCharacters.
              super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
              _M_size);
  return __return_storage_ptr__;
}

Assistant:

PDFUsedFont::TextMeasures PDFUsedFont::CalculateTextDimensions(const std::string& inText,long inFontSize)
{
	UIntList glyphs;
    UnicodeString unicode;
        
    unicode.FromUTF8(inText);
	mFaceWrapper.GetGlyphsForUnicodeText(unicode.GetUnicodeList(),glyphs);
	return CalculateTextDimensions(glyphs,inFontSize);
}